

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiles.hpp
# Opt level: O1

State * __thiscall Tiles::initial(State *__return_storage_ptr__,Tiles *this)

{
  char cVar1;
  short sVar5;
  short sVar6;
  undefined8 uVar7;
  ulong uVar8;
  undefined1 auVar9 [12];
  long lVar10;
  Fatal *this_00;
  byte bVar11;
  uint in_R8D;
  byte bVar12;
  int iVar13;
  int iVar14;
  undefined1 auVar15 [16];
  short sVar16;
  undefined1 auVar19 [16];
  uint uVar20;
  uint uVar22;
  uint uVar23;
  undefined1 auVar21 [16];
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar32;
  long lVar31;
  uint uVar33;
  short sVar34;
  uint uVar35;
  uint uVar41;
  uint uVar42;
  undefined1 auVar36 [16];
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  long lVar56;
  char cVar2;
  char cVar3;
  char cVar4;
  undefined4 uVar17;
  undefined6 uVar18;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 uVar39;
  undefined2 uVar40;
  
  __return_storage_ptr__->blank = -1;
  auVar15 = _DAT_00112020;
  lVar10 = 0;
  do {
    auVar19 = *(undefined1 (*) [16])(this + lVar10 * 4);
    auVar21._0_4_ = -(uint)(auVar19._0_4_ == 0);
    auVar21._4_4_ = -(uint)(auVar19._4_4_ == 0);
    auVar21._8_4_ = -(uint)(auVar19._8_4_ == 0);
    auVar21._12_4_ = -(uint)(auVar19._12_4_ == 0);
    in_R8D = movmskps(in_R8D,auVar21);
    if (in_R8D != 0) {
      bVar12 = ((byte)in_R8D & 2) >> 1;
      uVar20 = in_R8D & 4;
      bVar11 = (byte)in_R8D >> 3;
      in_R8D = CONCAT31((int3)(in_R8D >> 8),bVar11);
      if (uVar20 != 0) {
        bVar12 = 2;
      }
      if (bVar11 != 0) {
        bVar12 = 3;
      }
      __return_storage_ptr__->blank = bVar12 + (char)lVar10;
    }
    auVar19 = auVar19 & auVar15;
    sVar34 = auVar19._0_2_;
    cVar1 = (0 < sVar34) * (sVar34 < 0x100) * auVar19[0] - (0xff < sVar34);
    sVar34 = auVar19._2_2_;
    sVar16 = CONCAT11((0 < sVar34) * (sVar34 < 0x100) * auVar19[2] - (0xff < sVar34),cVar1);
    sVar34 = auVar19._4_2_;
    cVar2 = (0 < sVar34) * (sVar34 < 0x100) * auVar19[4] - (0xff < sVar34);
    sVar34 = auVar19._6_2_;
    uVar17 = CONCAT13((0 < sVar34) * (sVar34 < 0x100) * auVar19[6] - (0xff < sVar34),
                      CONCAT12(cVar2,sVar16));
    sVar34 = auVar19._8_2_;
    cVar3 = (0 < sVar34) * (sVar34 < 0x100) * auVar19[8] - (0xff < sVar34);
    sVar34 = auVar19._10_2_;
    uVar18 = CONCAT15((0 < sVar34) * (sVar34 < 0x100) * auVar19[10] - (0xff < sVar34),
                      CONCAT14(cVar3,uVar17));
    sVar34 = auVar19._12_2_;
    cVar4 = (0 < sVar34) * (sVar34 < 0x100) * auVar19[0xc] - (0xff < sVar34);
    sVar6 = auVar19._14_2_;
    sVar34 = (short)((uint)uVar17 >> 0x10);
    sVar5 = (short)((uint6)uVar18 >> 0x20);
    sVar6 = (short)(CONCAT17((0 < sVar6) * (sVar6 < 0x100) * auVar19[0xe] - (0xff < sVar6),
                             CONCAT16(cVar4,uVar18)) >> 0x30);
    *(uint *)(__return_storage_ptr__->tiles + lVar10) =
         CONCAT13((0 < sVar6) * (sVar6 < 0x100) * cVar4 - (0xff < sVar6),
                  CONCAT12((0 < sVar5) * (sVar5 < 0x100) * cVar3 - (0xff < sVar5),
                           CONCAT11((0 < sVar34) * (sVar34 < 0x100) * cVar2 - (0xff < sVar34),
                                    (0 < sVar16) * (sVar16 < 0x100) * cVar1 - (0xff < sVar16))));
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0x10);
  cVar1 = __return_storage_ptr__->blank;
  if (-1 < cVar1) {
    iVar13 = (int)cVar1;
    iVar14 = (int)(cVar1 >> 7);
    uVar20 = 0;
    uVar22 = 1;
    uVar23 = 2;
    uVar24 = 3;
    uVar25 = 0;
    uVar27 = 0;
    uVar29 = 0;
    uVar32 = 0;
    lVar10 = 0;
    auVar15 = _DAT_00112030;
    auVar19 = _DAT_00112040;
    do {
      uVar17 = *(undefined4 *)(__return_storage_ptr__->tiles + lVar10);
      uVar39 = (undefined1)((uint)uVar17 >> 0x18);
      uVar40 = CONCAT11(uVar39,uVar39);
      uVar39 = (undefined1)((uint)uVar17 >> 0x10);
      uVar7 = CONCAT35(CONCAT21(uVar40,uVar39),CONCAT14(uVar39,uVar17));
      uVar39 = (undefined1)((uint)uVar17 >> 8);
      uVar18 = CONCAT51(CONCAT41((int)((ulong)uVar7 >> 0x20),uVar39),uVar39);
      sVar34 = CONCAT11((char)uVar17,(char)uVar17);
      uVar8 = CONCAT62(uVar18,sVar34);
      auVar38._8_4_ = 0;
      auVar38._0_8_ = uVar8;
      auVar38._12_2_ = uVar40;
      auVar38._14_2_ = uVar40;
      uVar40 = (undefined2)((ulong)uVar7 >> 0x20);
      auVar37._12_4_ = auVar38._12_4_;
      auVar37._8_2_ = 0;
      auVar37._0_8_ = uVar8;
      auVar37._10_2_ = uVar40;
      auVar36._10_6_ = auVar37._10_6_;
      auVar36._8_2_ = uVar40;
      auVar36._0_8_ = uVar8;
      uVar40 = (undefined2)uVar18;
      auVar9._4_8_ = auVar36._8_8_;
      auVar9._2_2_ = uVar40;
      auVar9._0_2_ = uVar40;
      uVar35 = (int)sVar34 >> 8;
      uVar41 = auVar9._0_4_ >> 0x18;
      uVar42 = auVar36._8_4_ >> 0x18;
      uVar43 = auVar37._12_4_ >> 0x18;
      uVar48 = (uVar35 >> 0x1e) + uVar35;
      uVar49 = (uVar41 >> 0x1e) + uVar41;
      uVar50 = (uVar42 >> 0x1e) + uVar42;
      uVar51 = (uVar43 >> 0x1e) + uVar43;
      uVar44 = ((int)uVar48 >> 2) - (uVar20 >> 2);
      uVar45 = ((int)uVar49 >> 2) - (uVar22 >> 2);
      uVar46 = ((int)uVar50 >> 2) - (uVar23 >> 2);
      uVar47 = ((int)uVar51 >> 2) - (uVar24 >> 2);
      uVar52 = (int)uVar44 >> 0x1f;
      uVar53 = (int)uVar45 >> 0x1f;
      uVar54 = (int)uVar46 >> 0x1f;
      uVar55 = (int)uVar47 >> 0x1f;
      lVar31 = auVar19._8_8_;
      lVar56 = auVar15._8_8_;
      uVar26 = -(uint)(auVar19._4_4_ == iVar14 && auVar19._0_4_ == iVar13);
      uVar28 = -(uint)(auVar19._8_4_ == iVar13 && auVar19._12_4_ == iVar14);
      uVar30 = -(uint)(auVar15._4_4_ == iVar14 && auVar15._0_4_ == iVar13);
      uVar33 = -(uint)(auVar15._8_4_ == iVar13 && auVar15._12_4_ == iVar14);
      uVar35 = uVar35 - (uVar48 & 0xfffffffc);
      uVar41 = (uVar41 - (uVar49 & 0xfffffffc)) - (uVar22 & 3);
      uVar42 = (uVar42 - (uVar50 & 0xfffffffc)) - (uVar23 & 3);
      uVar43 = (uVar43 - (uVar51 & 0xfffffffc)) - (uVar24 & 3);
      uVar48 = (int)uVar35 >> 0x1f;
      uVar49 = (int)uVar41 >> 0x1f;
      uVar50 = (int)uVar42 >> 0x1f;
      uVar51 = (int)uVar43 >> 0x1f;
      uVar25 = ~uVar26 & ((uVar44 ^ uVar52) - uVar52) + uVar25 + ((uVar35 ^ uVar48) - uVar48) |
               uVar25 & uVar26;
      uVar27 = ~uVar28 & ((uVar45 ^ uVar53) - uVar53) + uVar27 + ((uVar41 ^ uVar49) - uVar49) |
               uVar27 & uVar28;
      uVar29 = ~uVar30 & ((uVar46 ^ uVar54) - uVar54) + uVar29 + ((uVar42 ^ uVar50) - uVar50) |
               uVar29 & uVar30;
      uVar32 = ~uVar33 & ((uVar47 ^ uVar55) - uVar55) + uVar32 + ((uVar43 ^ uVar51) - uVar51) |
               uVar32 & uVar33;
      lVar10 = lVar10 + 4;
      auVar19._0_8_ = auVar19._0_8_ + 4;
      auVar19._8_8_ = lVar31 + 4;
      auVar15._0_8_ = auVar15._0_8_ + 4;
      auVar15._8_8_ = lVar56 + 4;
      uVar20 = uVar20 + 4;
      uVar22 = uVar22 + 4;
      uVar23 = uVar23 + 4;
      uVar24 = uVar24 + 4;
    } while (lVar10 != 0x10);
    __return_storage_ptr__->h = (char)uVar32 + (char)uVar27 + (char)uVar29 + (char)uVar25;
    return __return_storage_ptr__;
  }
  this_00 = (Fatal *)__cxa_allocate_exception(0x80);
  Fatal::Fatal(this_00,"No blank tile");
  __cxa_throw(this_00,&Fatal::typeinfo,0);
}

Assistant:

State initial() const {
        State s;
        s.blank = -1;
        for (int i = 0; i < Ntiles; i++) {
            if (init[i] == 0)
                s.blank = i;
            s.tiles[i] = init[i];
        }
        if (s.blank < 0)
            throw Fatal("No blank tile");
        s.h = mdist(s.blank, s.tiles);
        return s;
    }